

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>
          (EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,FloatDuration<std::chrono::_V2::steady_clock> resolution)

{
  Detail *pDVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  anon_class_4_1_54a3980b *in_RSI;
  anon_class_1_0_00000001_for_time_clock *in_R8;
  double dVar2;
  anon_class_1_0_00000001_for_time_clock time_clock;
  vector<double,_std::allocator<double>_> times;
  anon_class_16_2_7d74a361 in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  TimingOf<std::chrono::_V2::steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&,_run_for_at_least_argument_t<steady_clock,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7144:35)_&>_>
  local_38;
  
  local_40 = 1000000000.0;
  if (resolution.__r * 100000.0 <= 1000000000.0) {
    local_40 = resolution.__r * 100000.0;
  }
  local_38.elapsed.__r._0_4_ = 1;
  operator()((Detail *)&local_38,in_RSI);
  last._M_current = (double *)&stack0xffffffffffffffa7;
  run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>(std::chrono::duration<double,std::chrono::_V2::steady_clock::period>)::_lambda(int)_1_&>
            (&local_38,(Detail *)0x989680,(ClockDuration<std::chrono::_V2::steady_clock>)0x2710,
             (int)last._M_current,in_R8);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar2 = ceil(local_40 /
               (double)CONCAT44(local_38.elapsed.__r._4_4_,(undefined4)local_38.elapsed.__r));
  std::vector<double,_std::allocator<double>_>::reserve(&local_58,(long)(int)dVar2);
  std::
  generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,Catch::Benchmark::Detail::estimate_clock_cost<std::chrono::_V2::steady_clock>(std::chrono::duration<double,std::chrono::_V2::steady_clock::period>)::_lambda()_1_>
            (&local_58,(int)dVar2,in_stack_ffffffffffffff98);
  dVar2 = 0.0;
  for (pDVar1 = (Detail *)
                local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pDVar1 != (Detail *)
                local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pDVar1 = pDVar1 + 8) {
    dVar2 = dVar2 + *(double *)pDVar1;
  }
  (__return_storage_ptr__->mean).__r =
       dVar2 / (double)((long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&__return_storage_ptr__->outliers,
             (Detail *)
             local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,last);
  if ((Detail *)
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (Detail *)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

EnvironmentEstimate<FloatDuration<Clock>> estimate_clock_cost(FloatDuration<Clock> resolution) {
                auto time_limit = (std::min)(
                    resolution * clock_cost_estimation_tick_limit,
                    FloatDuration<Clock>(clock_cost_estimation_time_limit));
                auto time_clock = [](int k) {
                    return Detail::measure<Clock>([k] {
                        for (int i = 0; i < k; ++i) {
                            volatile auto ignored = Clock::now();
                            (void)ignored;
                        }
                    }).elapsed;
                };
                time_clock(1);
                int iters = clock_cost_estimation_iterations;
                auto&& r = run_for_at_least<Clock>(std::chrono::duration_cast<ClockDuration<Clock>>(clock_cost_estimation_time), iters, time_clock);
                std::vector<double> times;
                int nsamples = static_cast<int>(std::ceil(time_limit / r.elapsed));
                times.reserve(nsamples);
                std::generate_n(std::back_inserter(times), nsamples, [time_clock, &r] {
                    return static_cast<double>((time_clock(r.iterations) / r.iterations).count());
                });
                return {
                    FloatDuration<Clock>(mean(times.begin(), times.end())),
                    classify_outliers(times.begin(), times.end()),
                };
            }